

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

char * Am_Merge_Pathname(char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  string *psVar4;
  char *__dest;
  char *__src;
  Am_Filename found;
  Am_Filename local_60;
  Am_Filename local_40;
  
  paVar1 = &local_60.filename.field_2;
  local_60.filename._M_string_length = 0;
  local_60.filename.field_2._M_local_buf[0] = '\0';
  local_60.filename._M_dataplus._M_p = (pointer)paVar1;
  Am_Filename::Am_Filename(&local_40,name);
  bVar2 = Am_Data_Locator::Find_File(&Am_Default_Data_Locator,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.filename._M_dataplus._M_p != &local_40.filename.field_2) {
    operator_delete(local_40.filename._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to locate file \'",0x17);
    if (name == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2f74d0);
    }
    else {
      sVar3 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  psVar4 = Am_Filename::name_abi_cxx11_(&local_60);
  __dest = (char *)operator_new__(psVar4->_M_string_length + 1);
  __src = Am_Filename::c_str(&local_60);
  strcpy(__dest,__src);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.filename._M_dataplus._M_p);
  }
  return __dest;
}

Assistant:

const char *
Am_Merge_Pathname(const char *name)
{
#if 0
  const char *am_dir = Am_Get_Amulet_Pathname();
  if (!am_dir) am_dir = "..";
  char *ret_val = new char [(strlen(am_dir) + strlen(name) + 2)];

  strcpy(ret_val, am_dir);
  strcat(ret_val, "/");
  strcat(ret_val, name);
  return ret_val;
#else
  Am_Filename found;
  const bool ok = Am_Default_Data_Locator.Find_File(name, found);
  if (!ok) {
    std::cout << "Unable to locate file '" << name << "'" << std::endl;
  }
  char *ret_val = new char[found.name().length() + 1];
  strcpy(ret_val, found.c_str());
  return ret_val;
#endif
}